

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)

{
  float fVar1;
  float fVar2;
  char cVar3;
  int iVar4;
  ImGuiKey key;
  ImGuiInputEvent *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  char cVar8;
  uint uVar9;
  ImGuiKeyChord IVar10;
  undefined7 uVar13;
  ImGuiKeyData *pIVar11;
  char *pcVar12;
  uint uVar14;
  ulong uVar15;
  undefined7 in_register_00000039;
  ImVector<ImGuiInputEvent> *pIVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  int n;
  long lVar20;
  long lVar21;
  bool bVar22;
  undefined4 uVar23;
  unsigned_short local_d2;
  ImVector<ImGuiInputEvent> *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  ImGuiIO *local_a8;
  ImVector<unsigned_short> *local_a0;
  ImGuiKeyData *local_98;
  ulong local_90;
  ImBitArray<652,_0> key_changed_mask;
  
  pIVar7 = GImGui;
  uVar14 = 0;
  local_c0 = 0;
  if ((int)CONCAT71(in_register_00000039,trickle_fast_inputs) != 0) {
    local_c0 = (ulong)(GImGui->WantTextInputNextFrame == 1);
  }
  local_a8 = &GImGui->IO;
  key_changed_mask.Storage[0x10] = 0;
  key_changed_mask.Storage[0x11] = 0;
  key_changed_mask.Storage[0x12] = 0;
  key_changed_mask.Storage[0x13] = 0;
  key_changed_mask.Storage[0xc] = 0;
  key_changed_mask.Storage[0xd] = 0;
  key_changed_mask.Storage[0xe] = 0;
  key_changed_mask.Storage[0xf] = 0;
  key_changed_mask.Storage[8] = 0;
  key_changed_mask.Storage[9] = 0;
  key_changed_mask.Storage[10] = 0;
  key_changed_mask.Storage[0xb] = 0;
  key_changed_mask.Storage[0x14] = 0;
  key_changed_mask.Storage[4] = 0;
  key_changed_mask.Storage[5] = 0;
  key_changed_mask.Storage[6] = 0;
  key_changed_mask.Storage[7] = 0;
  key_changed_mask.Storage[0] = 0;
  key_changed_mask.Storage[1] = 0;
  key_changed_mask.Storage[2] = 0;
  key_changed_mask.Storage[3] = 0;
  pIVar16 = &GImGui->InputEventsQueue;
  local_a0 = &(GImGui->IO).InputQueueCharacters;
  local_98 = (GImGui->IO).KeysData;
  lVar20 = 0;
  bVar6 = false;
  bVar22 = false;
  local_c8 = 0;
  local_b8 = 0;
  local_d0 = pIVar16;
  for (uVar15 = 0; (long)uVar15 < (long)pIVar16->Size; uVar15 = uVar15 + 1) {
    pIVar5 = (pIVar7->InputEventsQueue).Data;
    iVar4 = *(int *)((long)&pIVar5->Type + lVar20);
    uVar13 = (undefined7)
             ((ulong)((long)&switchD_001c468e::switchdataD_00227b3c +
                     (long)(int)(&switchD_001c468e::switchdataD_00227b3c)[iVar4 - 1]) >> 8);
    switch(iVar4) {
    case 1:
      if ((trickle_fast_inputs) &&
         ((((uVar14 != 0 || ((local_c8 & 1) != 0)) || (bVar22)) || (bVar6)))) goto LAB_001c49b8;
      (pIVar7->IO).MousePos = *(ImVec2 *)((long)&pIVar5->field_2 + lVar20);
      local_b8 = CONCAT71(uVar13,1);
      break;
    case 2:
      if ((trickle_fast_inputs) && (uVar14 != 0 || (local_b8 & 1) != 0)) goto LAB_001c49b8;
      (pIVar7->IO).MouseWheelH =
           *(float *)((long)&pIVar5->field_2 + lVar20) + (pIVar7->IO).MouseWheelH;
      (pIVar7->IO).MouseWheel =
           *(float *)((long)&pIVar5->field_2 + lVar20 + 4) + (pIVar7->IO).MouseWheel;
      local_c8 = CONCAT71(uVar13,1);
      break;
    case 3:
      iVar4 = *(int *)((long)&pIVar5->field_2 + lVar20);
      uVar9 = 1 << ((byte)iVar4 & 0x1f);
      if ((trickle_fast_inputs) && (((uVar14 & uVar9) != 0 || ((local_c8 & 1) != 0))))
      goto LAB_001c49b8;
      (pIVar7->IO).MouseDown[iVar4] = *(bool *)((long)&pIVar5->field_2 + lVar20 + 4);
      uVar14 = uVar14 | uVar9;
      break;
    case 4:
      key = *(ImGuiKey *)((long)&pIVar5->field_2 + lVar20);
      local_90 = (ulong)key;
      pIVar11 = GetKeyData(key);
      uVar18 = (ulong)((long)pIVar11 - (long)local_98) >> 4;
      uVar9 = (uint)uVar18;
      if (trickle_fast_inputs) {
        cVar3 = *(char *)((long)&pIVar5->field_2 + lVar20 + 4);
        cVar8 = pIVar11->Down;
        if ((pIVar11->Down != (bool)cVar3) &&
           ((((key_changed_mask.Storage[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0 || (bVar6)) ||
            (cVar8 = cVar3, uVar14 != 0)))) goto LAB_001c49b8;
      }
      else {
        cVar8 = *(char *)((long)&pIVar5->field_2 + lVar20 + 4);
      }
      pIVar11->Down = (bool)cVar8;
      pIVar11->AnalogValue = *(float *)((long)&pIVar5->field_2 + lVar20 + 8);
      key_changed_mask.Storage[(int)uVar9 >> 5] =
           key_changed_mask.Storage[(int)uVar9 >> 5] | 1 << ((byte)uVar18 & 0x1f);
      iVar4 = (int)local_90;
      switch(iVar4 << 0x14 | iVar4 - 0x1000U >> 0xc) {
      case 0:
        (pIVar7->IO).KeyCtrl = (bool)cVar8;
        if (iVar4 == 0x8000) break;
        if (iVar4 == 0x4000) {
LAB_001c4947:
          (pIVar7->IO).KeyAlt = pIVar11->Down;
        }
        else if (iVar4 == 0x2000) {
          (pIVar7->IO).KeyShift = pIVar11->Down;
        }
        goto LAB_001c496c;
      case 1:
        (pIVar7->IO).KeyShift = (bool)cVar8;
        if (iVar4 != 0x8000) {
          if (iVar4 == 0x4000) goto LAB_001c4947;
          goto LAB_001c496c;
        }
        break;
      default:
        goto switchD_001c4879_caseD_2;
      case 3:
        (pIVar7->IO).KeyAlt = (bool)cVar8;
        if (iVar4 != 0x8000) goto LAB_001c496c;
        break;
      case 7:
        break;
      }
      (pIVar7->IO).KeySuper = pIVar11->Down;
LAB_001c496c:
      IVar10 = GetMergedModsFromBools();
      (pIVar7->IO).KeyMods = IVar10;
      cVar8 = pIVar11->Down;
switchD_001c4879_caseD_2:
      (pIVar7->IO).KeysDown[(int)uVar9] = (bool)cVar8;
      lVar21 = (long)(pIVar7->IO).KeyMap[(int)uVar9];
      bVar22 = true;
      pIVar16 = local_d0;
      if (lVar21 != -1) {
        (pIVar7->IO).KeysDown[lVar21] = pIVar11->Down;
      }
      break;
    case 5:
      if (trickle_fast_inputs) {
        if (bVar22) {
          if (uVar14 != 0 || (char)local_c0 != '\0') goto LAB_001c49b8;
        }
        else if (uVar14 != 0) goto LAB_001c49b8;
        if (((local_b8 & 1) != 0) || ((local_c8 & 1) != 0)) goto LAB_001c49b8;
      }
      uVar9 = *(uint *)((long)&pIVar5->field_2 + lVar20);
      local_d2 = (unsigned_short)uVar9;
      if (0xffff < uVar9) {
        local_d2 = 0xfffd;
      }
      ImVector<unsigned_short>::push_back(local_a0,&local_d2);
      pIVar16 = local_d0;
      if ((char)local_c0 != '\0') {
        bVar6 = true;
      }
      break;
    case 6:
      (pIVar7->IO).AppFocusLost = (bool)(*(byte *)((long)&pIVar5->field_2 + lVar20) ^ 1);
    }
    lVar20 = lVar20 + 0x18;
  }
LAB_001c49b8:
  lVar21 = 0;
  uVar18 = uVar15;
  local_b0 = lVar20;
  while (bVar22 = uVar18 != 0, uVar18 = uVar18 - 1, bVar22) {
    ImVector<ImGuiInputEvent>::push_back
              (&pIVar7->InputEventsTrail,
               (ImGuiInputEvent *)((long)&((pIVar7->InputEventsQueue).Data)->Type + lVar21));
    lVar21 = lVar21 + 0x18;
  }
  if ((uVar15 != 0) && ((pIVar7->DebugLogFlags & 0x20) != 0)) {
    lVar20 = 0xc;
    for (uVar18 = 0; (long)uVar18 < (long)local_d0->Size; uVar18 = uVar18 + 1) {
      pcVar19 = "Remaining";
      if (uVar18 < uVar15) {
        pcVar19 = "Processed";
      }
      pIVar5 = (pIVar7->InputEventsQueue).Data;
      switch(*(undefined4 *)((long)pIVar5 + lVar20 + -0xc)) {
      case 1:
        fVar2 = *(float *)((long)pIVar5 + lVar20 + -4);
        if (((fVar2 != -3.4028235e+38) || (NAN(fVar2))) ||
           ((fVar1 = *(float *)((long)&pIVar5->Type + lVar20), fVar1 != -3.4028235e+38 ||
            (NAN(fVar1))))) {
          if ((GImGui->DebugLogFlags & 0x20) != 0) {
            uVar23 = SUB84((double)fVar2,0);
            fVar2 = *(float *)((long)&pIVar5->Type + lVar20);
            pcVar17 = "%s: MousePos (%.1f, %.1f)\n";
            goto LAB_001c4bf6;
          }
        }
        else if ((GImGui->DebugLogFlags & 0x20) != 0) {
          DebugLog("%s: MousePos (-FLT_MAX, -FLT_MAX)\n",pcVar19);
        }
        break;
      case 2:
        if ((GImGui->DebugLogFlags & 0x20) != 0) {
          uVar23 = SUB84((double)*(float *)((long)pIVar5 + lVar20 + -4),0);
          fVar2 = *(float *)((long)&pIVar5->Type + lVar20);
          pcVar17 = "%s: MouseWheel (%.1f, %.1f)\n";
LAB_001c4bf6:
          DebugLog(pcVar17,uVar23,(double)fVar2,pcVar19);
        }
        break;
      case 3:
        if ((GImGui->DebugLogFlags & 0x20) != 0) {
          pcVar17 = "GamepadDpadUp";
          if (*(char *)((long)&pIVar5->Type + lVar20) != '\0') {
            pcVar17 = "GamepadDpadDown";
          }
          DebugLog("%s: MouseButton %d %s\n",pcVar19,(ulong)*(uint *)((long)pIVar5 + lVar20 + -4),
                   pcVar17 + 0xb);
        }
        break;
      case 4:
        if ((GImGui->DebugLogFlags & 0x20) != 0) {
          pcVar12 = GetKeyName(*(ImGuiKey *)((long)pIVar5 + lVar20 + -4));
          pcVar17 = "GamepadDpadUp";
          if (*(char *)((long)&pIVar5->Type + lVar20) != '\0') {
            pcVar17 = "GamepadDpadDown";
          }
          DebugLog("%s: Key \"%s\" %s\n",pcVar19,pcVar12,pcVar17 + 0xb);
        }
        break;
      case 5:
        if ((GImGui->DebugLogFlags & 0x20) != 0) {
          DebugLog("%s: Text: %c (U+%08X)\n",pcVar19,(ulong)*(uint *)((long)pIVar5 + lVar20 + -4));
        }
        break;
      case 6:
        if ((GImGui->DebugLogFlags & 0x20) != 0) {
          DebugLog("%s: AppFocused %d\n",pcVar19,(ulong)*(byte *)((long)pIVar5 + lVar20 + -4));
        }
      }
      lVar20 = lVar20 + 0x18;
    }
  }
  if (local_d0->Size == (int)uVar15) {
    ImVector<ImGuiInputEvent>::resize(local_d0,0);
  }
  else {
    pIVar5 = (pIVar7->InputEventsQueue).Data;
    ImVector<ImGuiInputEvent>::erase
              (local_d0,pIVar5,(ImGuiInputEvent *)((long)&pIVar5->Type + local_b0));
  }
  if ((pIVar7->IO).AppFocusLost == true) {
    ImGuiIO::ClearInputKeys(local_a8);
  }
  return;
}

Assistant:

void ImGui::UpdateInputEvents(bool trickle_fast_inputs)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;

    // Only trickle chars<>key when working with InputText()
    // FIXME: InputText() could parse event trail?
    // FIXME: Could specialize chars<>keys trickling rules for control keys (those not typically associated to characters)
    const bool trickle_interleaved_keys_and_text = (trickle_fast_inputs && g.WantTextInputNextFrame == 1);

    bool mouse_moved = false, mouse_wheeled = false, key_changed = false, text_inputted = false;
    int  mouse_button_changed = 0x00;
    ImBitArray<ImGuiKey_KeysData_SIZE> key_changed_mask;

    int event_n = 0;
    for (; event_n < g.InputEventsQueue.Size; event_n++)
    {
        ImGuiInputEvent* e = &g.InputEventsQueue[event_n];
        if (e->Type == ImGuiInputEventType_MousePos)
        {
            // Trickling Rule: Stop processing queued events if we already handled a mouse button change
            ImVec2 event_pos(e->MousePos.PosX, e->MousePos.PosY);
            if (trickle_fast_inputs && (mouse_button_changed != 0 || mouse_wheeled || key_changed || text_inputted))
                break;
            io.MousePos = event_pos;
            mouse_moved = true;
        }
        else if (e->Type == ImGuiInputEventType_MouseButton)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            const ImGuiMouseButton button = e->MouseButton.Button;
            IM_ASSERT(button >= 0 && button < ImGuiMouseButton_COUNT);
            if (trickle_fast_inputs && ((mouse_button_changed & (1 << button)) || mouse_wheeled))
                break;
            io.MouseDown[button] = e->MouseButton.Down;
            mouse_button_changed |= (1 << button);
        }
        else if (e->Type == ImGuiInputEventType_MouseWheel)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the event
            if (trickle_fast_inputs && (mouse_moved || mouse_button_changed != 0))
                break;
            io.MouseWheelH += e->MouseWheel.WheelX;
            io.MouseWheel += e->MouseWheel.WheelY;
            mouse_wheeled = true;
        }
        else if (e->Type == ImGuiInputEventType_Key)
        {
            // Trickling Rule: Stop processing queued events if we got multiple action on the same button
            ImGuiKey key = e->Key.Key;
            IM_ASSERT(key != ImGuiKey_None);
            ImGuiKeyData* key_data = GetKeyData(key);
            const int key_data_index = (int)(key_data - g.IO.KeysData);
            if (trickle_fast_inputs && key_data->Down != e->Key.Down && (key_changed_mask.TestBit(key_data_index) || text_inputted || mouse_button_changed != 0))
                break;
            key_data->Down = e->Key.Down;
            key_data->AnalogValue = e->Key.AnalogValue;
            key_changed = true;
            key_changed_mask.SetBit(key_data_index);

            if (key == ImGuiMod_Ctrl || key == ImGuiMod_Shift || key == ImGuiMod_Alt || key == ImGuiMod_Super)
            {
                if (key == ImGuiMod_Ctrl) { io.KeyCtrl = key_data->Down; }
                if (key == ImGuiMod_Shift) { io.KeyShift = key_data->Down; }
                if (key == ImGuiMod_Alt) { io.KeyAlt = key_data->Down; }
                if (key == ImGuiMod_Super) { io.KeySuper = key_data->Down; }
                io.KeyMods = GetMergedModsFromBools();
            }

            // Allow legacy code using io.KeysDown[GetKeyIndex()] with new backends
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
            io.KeysDown[key_data_index] = key_data->Down;
            if (io.KeyMap[key_data_index] != -1)
                io.KeysDown[io.KeyMap[key_data_index]] = key_data->Down;
#endif
        }
        else if (e->Type == ImGuiInputEventType_Text)
        {
            // Trickling Rule: Stop processing queued events if keys/mouse have been interacted with
            if (trickle_fast_inputs && ((key_changed && trickle_interleaved_keys_and_text) || mouse_button_changed != 0 || mouse_moved || mouse_wheeled))
                break;
            unsigned int c = e->Text.Char;
            io.InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
            if (trickle_interleaved_keys_and_text)
                text_inputted = true;
        }
        else if (e->Type == ImGuiInputEventType_Focus)
        {
            // We intentionally overwrite this and process in NewFrame(), in order to give a chance
            // to multi-viewports backends to queue AddFocusEvent(false) + AddFocusEvent(true) in same frame.
            const bool focus_lost = !e->AppFocused.Focused;
            io.AppFocusLost = focus_lost;
        }
        else
        {
            IM_ASSERT(0 && "Unknown event!");
        }
    }

    // Record trail (for domain-specific applications wanting to access a precise trail)
    //if (event_n != 0) IMGUI_DEBUG_LOG_IO("Processed: %d / Remaining: %d\n", event_n, g.InputEventsQueue.Size - event_n);
    for (int n = 0; n < event_n; n++)
        g.InputEventsTrail.push_back(g.InputEventsQueue[n]);

    // [DEBUG]
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (event_n != 0 && (g.DebugLogFlags & ImGuiDebugLogFlags_EventIO))
        for (int n = 0; n < g.InputEventsQueue.Size; n++)
            DebugPrintInputEvent(n < event_n ? "Processed" : "Remaining", &g.InputEventsQueue[n]);
#endif

    // Remaining events will be processed on the next frame
    if (event_n == g.InputEventsQueue.Size)
        g.InputEventsQueue.resize(0);
    else
        g.InputEventsQueue.erase(g.InputEventsQueue.Data, g.InputEventsQueue.Data + event_n);

    // Clear buttons state when focus is lost
    // - this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle.
    // - we clear in EndFrame() and not now in order allow application/user code polling this flag
    //   (e.g. custom backend may want to clear additional data, custom widgets may want to react with a "canceling" event).
    if (g.IO.AppFocusLost)
        g.IO.ClearInputKeys();
}